

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O3

bool __thiscall QMimeData::hasText(QMimeData *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*(this->super_QObject)._vptr_QObject[0xc])();
  bVar2 = true;
  if ((char)iVar3 == '\0') {
    iVar3 = (*(this->super_QObject)._vptr_QObject[0xc])(this);
    bVar2 = true;
    if ((char)iVar3 == '\0') {
      bVar2 = hasUrls(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeData::hasText() const
{
    return hasFormat(textPlainLiteral()) || hasFormat(textPlainUtf8Literal()) || hasUrls();
}